

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::sendDisconnect(CoreBroker *this,action_t disconnectType)

{
  pointer pBVar1;
  BaseTimeCoordinator *pBVar2;
  pointer pBVar3;
  ActionMessage bye;
  ActionMessage local_1a0;
  ActionMessage local_e8;
  
  ActionMessage::ActionMessage(&local_e8,disconnectType);
  local_e8.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  pBVar1 = (this->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pBVar3 = (this->mBrokers).dataStorage.
                super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; pBVar3 != pBVar1; pBVar3 = pBVar3 + 1) {
    if (pBVar3->state < DISCONNECTED) {
      if ((pBVar3->parent).gid == (this->super_BrokerBase).global_broker_id_local.gid) {
        routeMessage(this,&local_e8,(GlobalFederateId)(pBVar3->global_id).gid);
        pBVar3->state = DISCONNECTED;
        pBVar3->_sent_disconnect_ack = true;
      }
      if ((this->super_BrokerBase).hasTimeDependency == true) {
        pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar2->_vptr_BaseTimeCoordinator[6])(pBVar2,(ulong)(uint)(pBVar3->global_id).gid);
        pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar2->_vptr_BaseTimeCoordinator[7])(pBVar2,(ulong)(uint)(pBVar3->global_id).gid);
      }
    }
    else if ((pBVar3->state == DISCONNECTED) && (pBVar3->_sent_disconnect_ack == false)) {
      ActionMessage::ActionMessage(&local_1a0,(uint)pBVar3->_core ^ cmd_disconnect_broker_ack);
      local_1a0.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      local_1a0.dest_id.gid = (pBVar3->global_id).gid;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)(pBVar3->route).rid,&local_1a0);
      pBVar3->_sent_disconnect_ack = true;
      ActionMessage::~ActionMessage(&local_1a0);
    }
  }
  if ((this->super_BrokerBase).hasTimeDependency == true) {
    BaseTimeCoordinator::disconnect
              ((this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
  }
  if ((this->super_BrokerBase).enable_profiling == true) {
    BrokerBase::writeProfilingData(&this->super_BrokerBase);
  }
  ActionMessage::~ActionMessage(&local_e8);
  return;
}

Assistant:

void CoreBroker::sendDisconnect(action_message_def::action_t disconnectType)
{
    ActionMessage bye(disconnectType);
    bye.source_id = global_broker_id_local;
    mBrokers.apply([this, &bye](auto& brk) {
        if (brk.state < ConnectionState::DISCONNECTED) {
            if (brk.parent == global_broker_id_local) {
                this->routeMessage(bye, brk.global_id);
                brk.state = ConnectionState::DISCONNECTED;
                brk._sent_disconnect_ack = true;
            }
            if (hasTimeDependency) {
                timeCoord->removeDependency(brk.global_id);
                timeCoord->removeDependent(brk.global_id);
            }
        } else if (brk.state == ConnectionState::DISCONNECTED) {
            if (brk._sent_disconnect_ack == false) {
                ActionMessage dis((brk._core) ? CMD_DISCONNECT_CORE_ACK :
                                                CMD_DISCONNECT_BROKER_ACK);
                dis.source_id = global_broker_id_local;
                dis.dest_id = brk.global_id;
                transmit(brk.route, dis);
                brk._sent_disconnect_ack = true;
            }
        }
    });
    if (hasTimeDependency) {
        timeCoord->disconnect();
    }
    if (enable_profiling) {
        writeProfilingData();
    }
}